

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void __thiscall
glslang::TBuiltIns::addSamplingFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  char *__s;
  int iVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  int iVar17;
  uint uVar18;
  byte bVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  int sparse;
  int iVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  TString s;
  int local_158;
  char local_140;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c0;
  ulong local_98;
  ulong local_90;
  long local_88;
  char *local_80;
  ulong local_78;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_68;
  char *local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_50;
  TString *local_48;
  char *local_40;
  char *local_38;
  
  uVar4 = (uint)sampler & 0xff00;
  bVar24 = ((uint)sampler & 0x140000) == 0x100000;
  uVar21 = (uint)sampler & 0x20000;
  bVar10 = (byte)(uVar21 >> 0x11);
  bVar1 = (byte)((uint)sampler >> 0x12);
  uVar18 = (uint)sampler >> 8 & 0xff;
  uVar11 = (uint)sampler & 0xff;
  local_58 = "float ";
  if (uVar11 == 3) {
    local_58 = "float16_t ";
  }
  local_60 = ", float";
  if (uVar11 == 3) {
    local_60 = ", float16_t";
  }
  local_60 = local_60 + 2;
  local_68 = (this->super_TBuiltInParseables).stageBuiltins + 4;
  local_70 = (this->super_TBuiltInParseables).stageBuiltins + 5;
  local_50 = &(this->super_TBuiltInParseables).commonBuiltins;
  local_48 = typeName;
  iVar5 = 0;
  do {
    if ((iVar5 == 0) || (((uVar4 | 0x200) != 0x600 && (((uint)sampler & 0x150000) == 0x100000)))) {
      iVar12 = 0;
      do {
        bVar26 = bVar24;
        if (iVar12 == 0) {
LAB_0040271b:
          iVar13 = 0;
          do {
            if ((iVar13 == 0) ||
               ((bVar26 &&
                ((((local_140 = sampler._1_1_, local_140 != '\x04' && (local_140 != '\x02')) ||
                  (((uint)sampler & 0x30000) != 0x30000)) && ((uVar4 != 0x500 && (uVar4 != 0x600))))
                )))) {
              iVar16 = 0;
              do {
                local_98 = (ulong)(uint)(iVar16 + iVar5);
                if (((uint)(iVar13 + iVar12 + iVar16 + iVar5) < 4) &&
                   ((iVar16 == 0 ||
                    (((uVar4 | 0x200) != 0x600 && (((uint)sampler >> 0x12 & 1) == 0)))))) {
                  iVar17 = 0;
                  do {
                    uVar6 = (int)local_98 + iVar17 + iVar13 + iVar12;
                    local_90 = (ulong)uVar6;
                    if (((uVar6 < 4) &&
                        ((((iVar13 != 0 || iVar12 != 0) | uVar4 == 0x400 | bVar10) & iVar17 != 0) ==
                         0)) && ((iVar17 == 0 &
                                 (((uint)sampler >> 0x14 & 1) == 0 | bVar1 & 1 | uVar4 == 0x600)) ==
                                 0)) {
                      bVar25 = iVar17 != 0;
                      local_38 = "sparseTexture";
                      if (bVar25) {
                        local_38 = "sparseTexel";
                      }
                      local_40 = "texture";
                      if (bVar25) {
                        local_40 = "texel";
                      }
                      bVar19 = bVar25 & bVar1;
                      iVar20 = 0;
                      do {
                        if (((iVar13 == 0 && iVar12 == 0) && (uVar4 != 0x600 && bVar24) ||
                             iVar20 == 0) && ((uint)((int)local_90 + iVar20) < 4)) {
                          iVar2 = 0;
                          do {
                            iVar8 = this->dimMap[uVar18] + ((uint)sampler >> 0x10 & 1);
                            iVar7 = 2;
                            if (2 < iVar8) {
                              iVar7 = iVar8;
                            }
                            if (uVar21 == 0) {
                              iVar7 = iVar8;
                            }
                            iVar7 = iVar7 + (uVar21 >> 0x11) + iVar5;
                            local_158 = 4;
                            if (uVar21 == 0) {
                              local_158 = iVar7;
                            }
                            if (iVar7 < 5) {
                              local_158 = iVar7;
                            }
                            if (4 < local_158) {
                              __assert_fail("totalDims <= 4",
                                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Initialize.cpp"
                                            ,0x1c68,
                                            "void glslang::TBuiltIns::addSamplingFunctions(TSampler, const TString &, int, EProfile)"
                                           );
                            }
                            if (iVar2 == 0 ||
                                ((iVar5 != 0 && (uVar4 != 0x300 && uVar21 == 0)) &
                                (byte)((uint)sampler >> 0x14) & 1) != 0) {
                              bVar3 = 4 < iVar7 & bVar10;
                              iVar7 = 0;
                              do {
                                if (iVar7 == 0) {
                                  lVar14 = 1;
LAB_00402995:
                                  if (iVar17 != 0) {
                                    lVar14 = 8;
                                  }
                                  local_88 = (long)local_158;
                                  __s = ",float16_t";
                                  if (iVar7 == 0) {
                                    __s = ",float";
                                  }
                                  local_80 = ",f16vec";
                                  if (iVar7 == 0) {
                                    local_80 = ",vec";
                                  }
                                  uVar22 = 0;
                                  do {
                                    iVar8 = (int)uVar22;
                                    if (((iVar12 == 0 && iVar5 == 0) && iVar17 == 0) &&
                                        (0x1c1 < version && profile != EEsProfile) || iVar8 == 0) {
                                      iVar23 = 0;
                                      local_78 = uVar22;
                                      do {
                                        if (iVar23 == 0) {
                                          local_c0._M_dataplus.super_allocator_type.allocator =
                                               GetThreadPoolAllocator();
                                          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                                          local_c0._M_string_length = 0;
                                          local_c0.field_2._M_local_buf[0] = '\0';
                                          pcVar15 = local_58;
                                          if (uVar21 == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,this->prefixes[uVar11]);
                                            pcVar15 = "vec4 ";
                                          }
LAB_00402ae1:
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append(&local_c0,pcVar15);
                                          pcVar15 = local_38;
                                          if (iVar23 == 0) {
                                            pcVar15 = local_40;
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append(&local_c0,pcVar15);
                                          if (iVar5 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Proj");
                                          }
                                          if (iVar12 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Lod");
                                          }
                                          if (iVar20 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Grad");
                                          }
                                          if (iVar17 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Fetch");
                                          }
                                          if (iVar16 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Offset");
                                          }
                                          if ((int)uVar22 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"Clamp");
                                          }
                                          if (iVar23 != 0 || (int)uVar22 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,"ARB");
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append(&local_c0,"(");
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::_M_append(&local_c0,(local_48->_M_dataplus)._M_p,
                                                      local_48->_M_string_length);
                                          if (iVar2 == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,",");
                                            if (local_158 == 1) {
                                              pcVar15 = TType::getBasicString((TBasicType)lVar14);
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,this->prefixes[lVar14]);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,"vec");
                                              pcVar15 = this->postfixes[local_88];
                                            }
                                          }
                                          else if (iVar7 == 0) {
                                            pcVar15 = ",vec4";
                                          }
                                          else {
                                            pcVar15 = ",f16vec4";
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append(&local_c0,pcVar15);
                                          if (bVar3 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,",float");
                                          }
                                          if (((iVar17 == 0) || (uVar4 == 0x500)) ||
                                             (uVar4 == 0x600)) {
                                            if (bVar19 != 0) goto LAB_00402c8e;
                                          }
                                          else if (((uint)sampler >> 0x12 & 1) == 0 || bVar19 != 0)
                                          {
LAB_00402c8e:
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,",int");
                                          }
                                          if (iVar12 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,__s);
                                          }
                                          pcVar15 = local_80;
                                          if (iVar20 != 0) {
                                            if (this->dimMap[uVar18] == 1) {
                                              if (iVar7 == 0) {
                                                pcVar15 = ",float,float";
                                              }
                                              else {
                                                pcVar15 = ",float16_t,float16_t";
                                              }
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,local_80);
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,
                                                       this->postfixes[this->dimMap[uVar18]]);
                                              uVar22 = local_78;
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,pcVar15);
                                              pcVar15 = this->postfixes[this->dimMap[uVar18]];
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,pcVar15);
                                          }
                                          if (iVar16 != 0) {
                                            if (this->dimMap[uVar18] == 1) {
                                              pcVar15 = ",int";
                                            }
                                            else {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,",ivec");
                                              pcVar15 = this->postfixes[this->dimMap[uVar18]];
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,pcVar15);
                                          }
                                          if ((int)uVar22 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,__s);
                                          }
                                          if (iVar23 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,",out ");
                                            pcVar15 = local_60;
                                            if (uVar21 == 0) {
                                              std::__cxx11::
                                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                              ::append(&local_c0,this->prefixes[uVar11]);
                                              pcVar15 = "vec4";
                                            }
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,pcVar15);
                                          }
                                          if (iVar13 != 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::append(&local_c0,__s);
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::append(&local_c0,");\n");
                                          this_00 = local_50;
                                          if ((iVar8 != 0 || iVar13 != 0) && iVar20 == 0) {
                                            std::__cxx11::
                                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                            ::_M_append(local_68,local_c0._M_dataplus._M_p,
                                                        local_c0._M_string_length);
                                            this_00 = local_70;
                                          }
                                          std::__cxx11::
                                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                          ::_M_append(this_00,local_c0._M_dataplus._M_p,
                                                      local_c0._M_string_length);
                                        }
                                        else if ((((0x1c1 < version && profile != EEsProfile) &&
                                                   iVar5 == 0) && (uVar4 != 0x100)) &&
                                                (uVar4 != 0x600)) {
                                          local_c0._M_dataplus.super_allocator_type.allocator =
                                               GetThreadPoolAllocator();
                                          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                                          local_c0._M_string_length = 0;
                                          local_c0.field_2._M_local_buf[0] = '\0';
                                          pcVar15 = "int ";
                                          goto LAB_00402ae1;
                                        }
                                        iVar23 = iVar23 + 1;
                                      } while (iVar23 == 1);
                                    }
                                    iVar8 = (int)uVar22;
                                    uVar22 = (ulong)(iVar8 + 1);
                                  } while (iVar8 == 0);
                                }
                                else if (uVar11 == 3) {
                                  lVar14 = 3;
                                  if (uVar21 != 0) {
                                    bVar9 = bVar3;
                                    if (bVar3 == 0) {
                                      bVar9 = 1;
                                    }
                                    local_158 = local_158 - ((byte)~bVar3 & 1);
                                    bVar3 = bVar9;
                                  }
                                  goto LAB_00402995;
                                }
                                bVar25 = iVar7 == 0;
                                iVar7 = iVar7 + 1;
                              } while (bVar25);
                            }
                            bVar25 = iVar2 == 0;
                            iVar2 = iVar2 + 1;
                          } while (bVar25);
                        }
                        bVar25 = iVar20 == 0;
                        iVar20 = iVar20 + 1;
                      } while (bVar25);
                    }
                    bVar25 = iVar17 == 0;
                    iVar17 = iVar17 + 1;
                  } while (bVar25);
                }
                bVar25 = iVar16 == 0;
                iVar16 = iVar16 + 1;
              } while (bVar25);
            }
            bVar25 = iVar13 == 0;
            iVar13 = iVar13 + 1;
          } while (bVar25);
        }
        else if (((uVar4 != 0x500) && (uVar4 != 0x600)) &&
                ((((uint)sampler & 0x2ff00) != 0x20400 && ((uint)sampler & 0x3ff00) != 0x30200) &&
                 bVar24)) {
          bVar26 = false;
          goto LAB_0040271b;
        }
        bVar26 = iVar12 == 0;
        iVar12 = iVar12 + 1;
      } while (bVar26);
    }
    bVar26 = iVar5 != 0;
    iVar5 = iVar5 + 1;
    if (bVar26) {
      return;
    }
  } while( true );
}

Assistant:

void TBuiltIns::addSamplingFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // texturing
    //
    for (int proj = 0; proj <= 1; ++proj) { // loop over "bool" projective or not

        if (proj && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.arrayed || sampler.isMultiSample()
            || !sampler.isCombined()))
            continue;

        for (int lod = 0; lod <= 1; ++lod) {

            if (lod && (sampler.isBuffer() || sampler.isRect() || sampler.isMultiSample() || !sampler.isCombined()))
                continue;
            if (lod && sampler.dim == Esd2D && sampler.arrayed && sampler.shadow)
                continue;
            if (lod && sampler.dim == EsdCube && sampler.shadow)
                continue;

            for (int bias = 0; bias <= 1; ++bias) {

                if (bias && (lod || sampler.isMultiSample() || !sampler.isCombined()))
                    continue;
                if (bias && (sampler.dim == Esd2D || sampler.dim == EsdCube) && sampler.shadow && sampler.arrayed)
                    continue;
                if (bias && (sampler.isRect() || sampler.isBuffer()))
                    continue;

                for (int offset = 0; offset <= 1; ++offset) { // loop over "bool" offset or not

                    if (proj + offset + bias + lod > 3)
                        continue;
                    if (offset && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.isMultiSample()))
                        continue;

                    for (int fetch = 0; fetch <= 1; ++fetch) { // loop over "bool" fetch or not

                        if (proj + offset + fetch + bias + lod > 3)
                            continue;
                        if (fetch && (lod || bias))
                            continue;
                        if (fetch && (sampler.shadow || sampler.dim == EsdCube))
                            continue;
                        if (fetch == 0 && (sampler.isMultiSample() || sampler.isBuffer()
                            || !sampler.isCombined()))
                            continue;

                        for (int grad = 0; grad <= 1; ++grad) { // loop over "bool" grad or not

                            if (grad && (lod || bias || sampler.isMultiSample() || !sampler.isCombined()))
                                continue;
                            if (grad && sampler.isBuffer())
                                continue;
                            if (proj + offset + fetch + grad + bias + lod > 3)
                                continue;

                            for (int extraProj = 0; extraProj <= 1; ++extraProj) {
                                bool compare = false;
                                int totalDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0);
                                // skip dummy unused second component for 1D non-array shadows
                                if (sampler.shadow && totalDims < 2)
                                    totalDims = 2;
                                totalDims += (sampler.shadow ? 1 : 0) + proj;
                                if (totalDims > 4 && sampler.shadow) {
                                    compare = true;
                                    totalDims = 4;
                                }
                                assert(totalDims <= 4);

                                if (extraProj && ! proj)
                                    continue;
                                if (extraProj && (sampler.dim == Esd3D || sampler.shadow || !sampler.isCombined()))
                                    continue;

                                // loop over 16-bit floating-point texel addressing
                                for (int f16TexAddr = 0; f16TexAddr <= 1; ++f16TexAddr)
                                {
                                    if (f16TexAddr && sampler.type != EbtFloat16)
                                        continue;
                                    if (f16TexAddr && sampler.shadow && ! compare) {
                                        compare = true; // compare argument is always present
                                        totalDims--;
                                    }
                                    // loop over "bool" lod clamp
                                    for (int lodClamp = 0; lodClamp <= 1 ;++lodClamp)
                                    {
                                        if (lodClamp && (profile == EEsProfile || version < 450))
                                            continue;
                                        if (lodClamp && (proj || lod || fetch))
                                            continue;

                                        // loop over "bool" sparse or not
                                        for (int sparse = 0; sparse <= 1; ++sparse)
                                        {
                                            if (sparse && (profile == EEsProfile || version < 450))
                                                continue;
                                            // Sparse sampling is not for 1D/1D array texture, buffer texture, and
                                            // projective texture
                                            if (sparse && (sampler.is1D() || sampler.isBuffer() || proj))
                                                continue;

                                            TString s;

                                            // return type
                                            if (sparse)
                                                s.append("int ");
                                            else {
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t ");
                                                    else
                                                        s.append("float ");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4 ");
                                                }
                                            }

                                            // name
                                            if (sparse) {
                                                if (fetch)
                                                    s.append("sparseTexel");
                                                else
                                                    s.append("sparseTexture");
                                            }
                                            else {
                                                if (fetch)
                                                    s.append("texel");
                                                else
                                                    s.append("texture");
                                            }
                                            if (proj)
                                                s.append("Proj");
                                            if (lod)
                                                s.append("Lod");
                                            if (grad)
                                                s.append("Grad");
                                            if (fetch)
                                                s.append("Fetch");
                                            if (offset)
                                                s.append("Offset");
                                            if (lodClamp)
                                                s.append("Clamp");
                                            if (lodClamp != 0 || sparse)
                                                s.append("ARB");
                                            s.append("(");

                                            // sampler type
                                            s.append(typeName);
                                            // P coordinate
                                            if (extraProj) {
                                                if (f16TexAddr)
                                                    s.append(",f16vec4");
                                                else
                                                    s.append(",vec4");
                                            } else {
                                                s.append(",");
                                                TBasicType t = fetch ? EbtInt : (f16TexAddr ? EbtFloat16 : EbtFloat);
                                                if (totalDims == 1)
                                                    s.append(TType::getBasicString(t));
                                                else {
                                                    s.append(prefixes[t]);
                                                    s.append("vec");
                                                    s.append(postfixes[totalDims]);
                                                }
                                            }
                                            // non-optional compare
                                            if (compare)
                                                s.append(",float");

                                            // non-optional lod argument (lod that's not driven by lod loop) or sample
                                            if ((fetch && !sampler.isBuffer() &&
                                                 !sampler.isRect() && !sampler.isMultiSample())
                                                 || (sampler.isMultiSample() && fetch))
                                                s.append(",int");
                                            // non-optional lod
                                            if (lod) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }

                                            // gradient arguments
                                            if (grad) {
                                                if (dimMap[sampler.dim] == 1) {
                                                    if (f16TexAddr)
                                                        s.append(",float16_t,float16_t");
                                                    else
                                                        s.append(",float,float");
                                                } else {
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }
                                            // offset
                                            if (offset) {
                                                if (dimMap[sampler.dim] == 1)
                                                    s.append(",int");
                                                else {
                                                    s.append(",ivec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }

                                            // lod clamp
                                            if (lodClamp) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            // texel out (for sparse texture)
                                            if (sparse) {
                                                s.append(",out ");
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t");
                                                    else
                                                        s.append("float");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4");
                                                }
                                            }
                                            // optional bias
                                            if (bias) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            s.append(");\n");

                                            // Add to the per-language set of built-ins
                                            if (!grad && (bias || lodClamp != 0)) {
                                                stageBuiltins[EShLangFragment].append(s);
                                                stageBuiltins[EShLangCompute].append(s);
                                            } else
                                                commonBuiltins.append(s);

                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}